

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

void __thiscall tcu::CommandLine::CommandLine(CommandLine *this,string *cmdLine)

{
  bool bVar1;
  Exception *this_00;
  allocator<char> local_49;
  string local_48;
  string *local_18;
  string *cmdLine_local;
  CommandLine *this_local;
  
  this->_vptr_CommandLine = (_func_int **)&PTR_registerExtendedOptions_032ec320;
  local_18 = cmdLine;
  cmdLine_local = (string *)this;
  de::cmdline::detail::CommandLine::CommandLine(&this->m_cmdLine);
  bVar1 = parse(this,local_18);
  if (!bVar1) {
    this_00 = (Exception *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Failed to parse command line",&local_49);
    Exception::Exception(this_00,&local_48);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

CommandLine::CommandLine (const std::string& cmdLine)
{
	if (!parse(cmdLine))
		throw Exception("Failed to parse command line");
}